

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<std::array<char,2ul>>::emplaceRealloc<std::array<char,2ul>const&>
          (SmallVectorBase<std::array<char,2ul>> *this,pointer pos,array<char,_2UL> *args)

{
  pointer paVar1;
  ulong uVar2;
  SmallVectorBase<std::array<char,2ul>> *__src;
  void *__dest;
  long lVar3;
  ulong uVar4;
  
  if (*(long *)(this + 8) != 0x3fffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0x3fffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0x3fffffffffffffff;
    }
    lVar3 = *(long *)this;
    __dest = operator_new(uVar4 * 2);
    paVar1 = (pointer)((long)__dest + ((long)pos - lVar3));
    *(undefined2 *)((long)__dest + ((long)pos - lVar3)) = *(undefined2 *)args->_M_elems;
    __src = *(SmallVectorBase<std::array<char,2ul>> **)this;
    lVar3 = *(long *)(this + 8);
    if (__src + (lVar3 * 2 - (long)pos) == (SmallVectorBase<std::array<char,2ul>> *)0x0) {
      if (lVar3 != 0) {
        memmove(__dest,__src,lVar3 * 2);
      }
    }
    else {
      if (__src != (SmallVectorBase<std::array<char,2ul>> *)pos) {
        memmove(__dest,__src,(long)pos - (long)__src);
      }
      memcpy(paVar1 + 1,pos,(size_t)(__src + (lVar3 * 2 - (long)pos)));
    }
    if (__src != this + 0x18) {
      operator_delete(__src);
      lVar3 = *(long *)(this + 8);
    }
    *(long *)(this + 8) = lVar3 + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(void **)this = __dest;
    return paVar1;
  }
  detail::throwLengthError();
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}